

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall
duckdb_re2::Compiler::PostVisit
          (Compiler *this,Regexp *re,Frag param_2,Frag param_3,Frag *child_frags,int nchild_frags)

{
  CharClass CVar1;
  Rune lo;
  CharClass *pCVar2;
  undefined1 auVar3 [13];
  bool foldcase;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Rune *pRVar8;
  EmptyOp empty;
  long lVar9;
  Rune *pRVar10;
  Frag FVar11;
  Frag FVar12;
  Frag a;
  Frag a_00;
  Frag a_01;
  Frag b;
  Frag b_00;
  Frag b_01;
  Frag b_02;
  uint32_t uStack_1c0;
  int iStack_1bc;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  if (this->failed_ == true) {
switchD_0182bff7_caseD_0:
    uVar7 = 0;
    uVar6 = 0;
    goto LAB_0182bfb5;
  }
  switch(re->op_) {
  case '\x01':
    goto switchD_0182bff7_caseD_0;
  case '\x02':
    goto switchD_0182bff7_caseD_1;
  case '\x03':
    FVar11 = Literal(this,(re->arguments).rune_,(bool)((byte)re->parse_flags_ & 1));
    auVar3 = FVar11._0_13_;
    break;
  case '\x04':
    iVar4 = (re->arguments).repeat.max_;
    if (iVar4 != 0) {
      uStack_1c0 = 0;
      iStack_1bc = (uint)iStack_1bc._1_3_ << 8;
      uVar7 = 0;
      if (0 < iVar4) {
        lVar9 = 0;
        do {
          FVar11 = Literal(this,*(Rune *)((long)&(((re->arguments).capture.name_)->_M_dataplus)._M_p
                                         + lVar9 * 4),(bool)((byte)re->parse_flags_ & 1));
          auVar3 = FVar11._0_13_;
          if (lVar9 != 0) {
            b_01._8_8_ = FVar11._8_8_ & 0xffffffffff;
            a_00._12_4_ = iStack_1bc;
            a_00.end.tail = uStack_1c0;
            a_00.begin = (int)uVar7;
            a_00.end.head = (int)((ulong)uVar7 >> 0x20);
            b_01.begin = (int)FVar11._0_8_;
            b_01.end.head = (int)((ulong)FVar11._0_8_ >> 0x20);
            FVar11 = Cat(this,a_00,b_01);
            auVar3 = FVar11._0_13_;
          }
          uVar7 = auVar3._0_8_;
          uStack_1c0 = auVar3._8_4_;
          iStack_1bc = CONCAT31(iStack_1bc._1_3_,auVar3[0xc]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (re->arguments).repeat.max_);
      }
      goto LAB_0182c3ef;
    }
    goto switchD_0182bff7_caseD_1;
  case '\x05':
    uVar7._0_4_ = child_frags->begin;
    uVar7._4_4_ = (child_frags->end).head;
    uVar6 = *(undefined8 *)&(child_frags->end).tail;
    uStack_1c0 = (uint32_t)uVar6;
    iStack_1bc = (int)((ulong)uVar6 >> 0x20);
    if (1 < nchild_frags) {
      lVar9 = 0;
      do {
        a_01._12_4_ = iStack_1bc;
        a_01.end.tail = uStack_1c0;
        a_01.begin = (int)uVar7;
        a_01.end.head = (int)((ulong)uVar7 >> 0x20);
        b_02._8_8_ = *(undefined8 *)((long)&child_frags[1].end.tail + lVar9);
        b_02._0_8_ = *(undefined8 *)((long)&child_frags[1].begin + lVar9);
        FVar11 = Cat(this,a_01,b_02);
        uVar7 = FVar11._0_8_;
        uStack_1c0 = FVar11.end.tail;
        iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar11.nullable);
        lVar9 = lVar9 + 0x10;
      } while ((ulong)(uint)nchild_frags * 0x10 + -0x10 != lVar9);
    }
    goto LAB_0182c3ef;
  case '\x06':
    uVar7._0_4_ = child_frags->begin;
    uVar7._4_4_ = (child_frags->end).head;
    uVar6 = *(undefined8 *)&(child_frags->end).tail;
    uStack_1c0 = (uint32_t)uVar6;
    iStack_1bc = (int)((ulong)uVar6 >> 0x20);
    if (1 < nchild_frags) {
      lVar9 = 0;
      do {
        FVar11._12_4_ = iStack_1bc;
        FVar11.end.tail = uStack_1c0;
        FVar11.begin = (int)uVar7;
        FVar11.end.head = (int)((ulong)uVar7 >> 0x20);
        b_00._8_8_ = *(undefined8 *)((long)&child_frags[1].end.tail + lVar9);
        b_00._0_8_ = *(undefined8 *)((long)&child_frags[1].begin + lVar9);
        FVar11 = Alt(this,FVar11,b_00);
        uVar7 = FVar11._0_8_;
        uStack_1c0 = FVar11.end.tail;
        iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar11.nullable);
        lVar9 = lVar9 + 0x10;
      } while ((ulong)(uint)nchild_frags * 0x10 + -0x10 != lVar9);
    }
    goto LAB_0182c3ef;
  case '\a':
    FVar11 = Star(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar3 = FVar11._0_13_;
    break;
  case '\b':
    FVar11 = Plus(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar3 = FVar11._0_13_;
    break;
  case '\t':
    FVar11 = Quest(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    auVar3 = FVar11._0_13_;
    break;
  default:
    this->failed_ = true;
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,"Missing case in Compiler: ",0x1a);
    std::ostream::operator<<(aoStack_1a8,(uint)re->op_);
    goto LAB_0182c432;
  case '\v':
    iVar4 = (re->arguments).repeat.max_;
    if (iVar4 < 0) {
      uVar7._0_4_ = child_frags->begin;
      uVar7._4_4_ = (child_frags->end).head;
      uVar6 = *(undefined8 *)&(child_frags->end).tail;
      uStack_1c0 = (uint32_t)uVar6;
      iStack_1bc = (int)((ulong)uVar6 >> 0x20);
      goto LAB_0182c3ef;
    }
    FVar11 = Capture(this,*child_frags,iVar4);
    auVar3 = FVar11._0_13_;
    break;
  case '\f':
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->rune_cache_)._M_h);
    (this->rune_range_).begin = 0;
    (this->rune_range_).end.head = 0;
    (this->rune_range_).end.tail = 0;
    AddRuneRange(this,0,0x10ffff,false);
LAB_0182c10c:
    uVar7._0_4_ = (this->rune_range_).begin;
    uVar7._4_4_ = (this->rune_range_).end.head;
    uVar6 = *(undefined8 *)&(this->rune_range_).end.tail;
    goto LAB_0182bfb5;
  case '\r':
    FVar11 = ByteRange(this,0,0xff,false);
    auVar3 = FVar11._0_13_;
    break;
  case '\x0e':
    empty = this->reversed_ + kEmptyBeginLine;
    goto LAB_0182c3db;
  case '\x0f':
    empty = kEmptyEndLine - this->reversed_;
    goto LAB_0182c3db;
  case '\x10':
    empty = kEmptyWordBoundary;
    goto LAB_0182c3db;
  case '\x11':
    empty = kEmptyNonWordBoundary;
    goto LAB_0182c3db;
  case '\x12':
    uVar5 = (uint)this->reversed_;
    goto LAB_0182c3d1;
  case '\x13':
    uVar5 = this->reversed_ ^ 1;
LAB_0182c3d1:
    empty = uVar5 * 4 + kEmptyBeginText;
LAB_0182c3db:
    FVar11 = EmptyWidth(this,empty);
    auVar3 = FVar11._0_13_;
    break;
  case '\x14':
    pCVar2 = (re->arguments).char_class.cc_;
    if (*(int *)(pCVar2 + 4) != 0) {
      CVar1 = *pCVar2;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->rune_cache_)._M_h);
      (this->rune_range_).begin = 0;
      (this->rune_range_).end.head = 0;
      (this->rune_range_).end.tail = 0;
      iVar4 = *(int *)(pCVar2 + 0x10);
      if (iVar4 != 0) {
        pRVar8 = *(Rune **)(pCVar2 + 8);
        pRVar10 = pRVar8;
        do {
          lo = *pRVar10;
          if (CVar1 == (CharClass)0x0) {
LAB_0182c06c:
            if (lo < 0x42) {
LAB_0182c071:
              uVar5 = pRVar10[1];
              if ((int)uVar5 < 0x7a) goto LAB_0182c080;
LAB_0182c090:
              foldcase = false;
            }
            else {
              uVar5 = pRVar10[1];
LAB_0182c080:
              if (0x7a < lo || (int)uVar5 < 0x41) goto LAB_0182c090;
              foldcase = (bool)((0x60 < uVar5 || lo < 0x5b) & (byte)CVar1);
            }
            AddRuneRange(this,lo,uVar5,foldcase);
            pRVar8 = *(Rune **)(pCVar2 + 8);
            iVar4 = *(int *)(pCVar2 + 0x10);
          }
          else {
            if (lo < 0x41) goto LAB_0182c071;
            if (0x5a < pRVar10[1]) goto LAB_0182c06c;
          }
          pRVar10 = pRVar10 + 2;
        } while (pRVar10 != pRVar8 + (long)iVar4 * 2);
      }
      goto LAB_0182c10c;
    }
    this->failed_ = true;
    std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_1a8,"No ranges in char class",0x17);
LAB_0182c432:
    std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
    std::ios_base::~ios_base(local_138);
    uVar7 = 0;
    uVar6 = 0;
LAB_0182bfb5:
    uStack_1c0 = (uint32_t)uVar6;
    iStack_1bc = CONCAT31(iStack_1bc._1_3_,(char)((ulong)uVar6 >> 0x20));
    goto LAB_0182c3ef;
  case '\x15':
    FVar11 = Match(this,(re->arguments).repeat.max_);
    uVar7 = FVar11._0_8_;
    uStack_1c0 = FVar11.end.tail;
    iStack_1bc = CONCAT31(iStack_1bc._1_3_,FVar11.nullable);
    if (this->anchor_ != ANCHOR_BOTH) goto LAB_0182c3ef;
    FVar11 = EmptyWidth(this,kEmptyEndText);
    b._12_4_ = iStack_1bc;
    b.end.tail = uStack_1c0;
    a._8_8_ = FVar11._8_8_ & 0xffffffffff;
    a.begin = (int)FVar11._0_8_;
    a.end.head = (int)((ulong)FVar11._0_8_ >> 0x20);
    b.begin = (int)uVar7;
    b.end.head = (int)((ulong)uVar7 >> 0x20);
    FVar11 = Cat(this,a,b);
    auVar3 = FVar11._0_13_;
  }
LAB_0182c3e0:
  uVar7 = auVar3._0_8_;
  uStack_1c0 = auVar3._8_4_;
  iStack_1bc = CONCAT31(iStack_1bc._1_3_,auVar3[0xc]);
LAB_0182c3ef:
  FVar12._12_4_ = iStack_1bc;
  FVar12.end.tail = uStack_1c0;
  FVar12.begin = (int)uVar7;
  FVar12.end.head = (int)((ulong)uVar7 >> 0x20);
  return FVar12;
switchD_0182bff7_caseD_1:
  FVar11 = Nop(this);
  auVar3 = FVar11._0_13_;
  goto LAB_0182c3e0;
}

Assistant:

Frag Compiler::PostVisit(Regexp* re, Frag, Frag, Frag* child_frags,
                         int nchild_frags) {
  // If a child failed, don't bother going forward, especially
  // since the child_frags might contain Frags with NULLs in them.
  if (failed_)
    return NoMatch();

  // Given the child fragments, return the fragment for this node.
  switch (re->op()) {
    case kRegexpRepeat:
      // Should not see; code at bottom of function will print error
      break;

    case kRegexpNoMatch:
      return NoMatch();

    case kRegexpEmptyMatch:
      return Nop();

    case kRegexpHaveMatch: {
      Frag f = Match(re->match_id());
      if (anchor_ == RE2::ANCHOR_BOTH) {
        // Append \z or else the subexpression will effectively be unanchored.
        // Complemented by the UNANCHORED case in CompileSet().
        f = Cat(EmptyWidth(kEmptyEndText), f);
      }
      return f;
    }

    case kRegexpConcat: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Cat(f, child_frags[i]);
      return f;
    }

    case kRegexpAlternate: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Alt(f, child_frags[i]);
      return f;
    }

    case kRegexpStar:
      return Star(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpPlus:
      return Plus(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpQuest:
      return Quest(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpLiteral:
      return Literal(re->rune(), (re->parse_flags()&Regexp::FoldCase) != 0);

    case kRegexpLiteralString: {
      // Concatenation of literals.
      if (re->nrunes() == 0)
        return Nop();
      Frag f;
      for (int i = 0; i < re->nrunes(); i++) {
        Frag f1 = Literal(re->runes()[i],
                          (re->parse_flags()&Regexp::FoldCase) != 0);
        if (i == 0)
          f = f1;
        else
          f = Cat(f, f1);
      }
      return f;
    }

    case kRegexpAnyChar:
      BeginRange();
      AddRuneRange(0, Runemax, false);
      return EndRange();

    case kRegexpAnyByte:
      return ByteRange(0x00, 0xFF, false);

    case kRegexpCharClass: {
      CharClass* cc = re->cc();
      if (cc->empty()) {
        // This can't happen.
        failed_ = true;
        LOG(DFATAL) << "No ranges in char class";
        return NoMatch();
      }

      // ASCII case-folding optimization: if the char class
      // behaves the same on A-Z as it does on a-z,
      // discard any ranges wholly contained in A-Z
      // and mark the other ranges as foldascii.
      // This reduces the size of a program for
      // (?i)abc from 3 insts per letter to 1 per letter.
      bool foldascii = cc->FoldsASCII();

      // Character class is just a big OR of the different
      // character ranges in the class.
      BeginRange();
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i) {
        // ASCII case-folding optimization (see above).
        if (foldascii && 'A' <= i->lo && i->hi <= 'Z')
          continue;

        // If this range contains all of A-Za-z or none of it,
        // the fold flag is unnecessary; don't bother.
        bool fold = foldascii;
        if ((i->lo <= 'A' && 'z' <= i->hi) || i->hi < 'A' || 'z' < i->lo ||
            ('Z' < i->lo && i->hi < 'a'))
          fold = false;

        AddRuneRange(i->lo, i->hi, fold);
      }
      return EndRange();
    }

    case kRegexpCapture:
      // If this is a non-capturing parenthesis -- (?:foo) --
      // just use the inner expression.
      if (re->cap() < 0)
        return child_frags[0];
      return Capture(child_frags[0], re->cap());

    case kRegexpBeginLine:
      return EmptyWidth(reversed_ ? kEmptyEndLine : kEmptyBeginLine);

    case kRegexpEndLine:
      return EmptyWidth(reversed_ ? kEmptyBeginLine : kEmptyEndLine);

    case kRegexpBeginText:
      return EmptyWidth(reversed_ ? kEmptyEndText : kEmptyBeginText);

    case kRegexpEndText:
      return EmptyWidth(reversed_ ? kEmptyBeginText : kEmptyEndText);

    case kRegexpWordBoundary:
      return EmptyWidth(kEmptyWordBoundary);

    case kRegexpNoWordBoundary:
      return EmptyWidth(kEmptyNonWordBoundary);
  }
  failed_ = true;
  LOG(DFATAL) << "Missing case in Compiler: " << re->op();
  return NoMatch();
}